

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_7::ReplaceSwizzleInvocationsMasked
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  TypeManager *pTVar5;
  DefUseManager *pDVar6;
  ConstantManager *pCVar7;
  Instruction *pIVar8;
  Instruction *pIVar9;
  Type *pTVar10;
  Constant *pCVar11;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint32_t local_104;
  TypeManager *local_100;
  Instruction *local_f8;
  Instruction *local_f0;
  uint32_t local_e4;
  Instruction *local_e0;
  SmallVector<unsigned_int,_2UL> local_d8;
  Instruction *local_b0;
  IRContext *local_a8;
  ConstantManager *local_a0;
  undefined1 local_98 [48];
  InstructionBuilder ir_builder;
  OperandList new_operands;
  
  pTVar5 = IRContext::get_type_mgr(ctx);
  pDVar6 = IRContext::get_def_use_mgr(ctx);
  pCVar7 = IRContext::get_constant_mgr(ctx);
  IRContext::AddCapability(ctx,CapabilityGroupNonUniformBallot);
  IRContext::AddCapability(ctx,CapabilityGroupNonUniformShuffle);
  InstructionBuilder::InstructionBuilder
            (&ir_builder,ctx,inst,kAnalysisInstrToBlockMapping|kAnalysisBegin);
  uVar1 = Instruction::GetSingleWordInOperand(inst,2);
  local_f0 = (Instruction *)CONCAT44(local_f0._4_4_,uVar1);
  uVar1 = Instruction::GetSingleWordInOperand(inst,3);
  pIVar8 = analysis::DefUseManager::GetDef(pDVar6,uVar1);
  if (pIVar8->opcode_ != OpConstantComposite) {
    __assert_fail("mask_inst->opcode() == spv::Op::OpConstantComposite && \"The mask is suppose to be a vector constant.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x158,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  local_100 = pTVar5;
  local_a0 = pCVar7;
  uVar1 = Instruction::NumInOperands(pIVar8);
  if (uVar1 == 3) {
    local_e0 = inst;
    uVar1 = Instruction::GetSingleWordInOperand(pIVar8,0);
    uVar2 = Instruction::GetSingleWordInOperand(pIVar8,1);
    uVar3 = Instruction::GetSingleWordInOperand(pIVar8,2);
    local_f8 = (Instruction *)CONCAT44(local_f8._4_4_,uVar3);
    uVar3 = IRContext::GetBuiltinInputVarId(ctx,0x29);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,"SPV_KHR_shader_ballot",(allocator<char> *)&local_d8);
    IRContext::AddExtension(ctx,(string *)local_98);
    std::__cxx11::string::_M_dispose();
    if (uVar3 != 0) {
      pDVar6 = IRContext::get_def_use_mgr(ctx);
      pIVar8 = analysis::DefUseManager::GetDef(pDVar6,uVar3);
      pDVar6 = IRContext::get_def_use_mgr(ctx);
      local_a8 = ctx;
      uVar4 = Instruction::type_id(pIVar8);
      pIVar8 = analysis::DefUseManager::GetDef(pDVar6,uVar4);
      uVar4 = Instruction::GetSingleWordInOperand(pIVar8,1);
      pIVar8 = InstructionBuilder::AddLoad(&ir_builder,uVar4,uVar3,0);
      uVar3 = InstructionBuilder::GetUintConstantId(&ir_builder,0xffffffe0);
      pIVar9 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar4,OpBitwiseOr,uVar1,uVar3);
      uVar1 = Instruction::result_id(pIVar8);
      uVar3 = Instruction::result_id(pIVar9);
      pIVar8 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar4,OpBitwiseAnd,uVar1,uVar3);
      uVar1 = Instruction::result_id(pIVar8);
      pIVar8 = InstructionBuilder::AddBinaryOp(&ir_builder,uVar4,OpBitwiseOr,uVar1,uVar2);
      uVar1 = Instruction::result_id(pIVar8);
      local_b0 = InstructionBuilder::AddBinaryOp
                           (&ir_builder,uVar4,OpBitwiseXor,uVar1,(uint32_t)local_f8);
      uVar1 = InstructionBuilder::GetUintConstantId(&ir_builder,0xffffffff);
      uVar2 = InstructionBuilder::GetUintConstantId(&ir_builder,3);
      pTVar5 = local_100;
      local_e4 = uVar2;
      pTVar10 = analysis::TypeManager::GetUIntVectorType(local_100,4);
      local_98._0_16_ = (undefined1  [16])0x0;
      local_98._16_8_ = 0;
      local_d8._vptr_SmallVector._0_4_ = uVar1;
      local_d8._vptr_SmallVector._4_4_ = uVar1;
      local_d8.size_._0_4_ = uVar1;
      local_d8.size_._4_4_ = uVar1;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_98,&local_d8);
      pCVar7 = local_a0;
      pCVar11 = analysis::ConstantManager::GetConstant
                          (local_a0,pTVar10,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
      pIVar8 = analysis::ConstantManager::GetDefiningInstruction
                         (pCVar7,pCVar11,0,(inst_iterator *)0x0);
      uVar1 = analysis::TypeManager::GetBoolTypeId(pTVar5);
      local_d8._vptr_SmallVector._0_4_ = uVar2;
      local_d8._vptr_SmallVector._4_4_ = Instruction::result_id(pIVar8);
      pIVar9 = local_b0;
      local_d8.size_._0_4_ = Instruction::result_id(local_b0);
      local_98._0_16_ = (undefined1  [16])0x0;
      local_98._16_8_ = 0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_98,&local_d8,
                 (undefined1 *)((long)&local_d8.size_ + 4));
      local_f8 = InstructionBuilder::AddNaryOp
                           (&ir_builder,uVar1,OpGroupNonUniformBallotBitExtract,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
      pIVar8 = local_e0;
      uVar1 = Instruction::type_id(local_e0);
      local_d8._vptr_SmallVector._0_4_ = local_e4;
      local_d8._vptr_SmallVector._4_4_ = local_f0._0_4_;
      local_d8.size_._0_4_ = Instruction::result_id(pIVar9);
      local_98._0_16_ = (undefined1  [16])0x0;
      local_98._16_8_ = 0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_98,&local_d8,
                 (undefined1 *)((long)&local_d8.size_ + 4));
      local_f0 = InstructionBuilder::AddNaryOp
                           (&ir_builder,uVar1,OpGroupNonUniformShuffle,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
      uVar1 = Instruction::type_id(pIVar8);
      pTVar10 = analysis::TypeManager::GetType(local_100,uVar1);
      local_98._0_16_ = (undefined1  [16])0x0;
      local_98._16_8_ = 0;
      pCVar11 = analysis::ConstantManager::GetConstant
                          (pCVar7,pTVar10,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
      local_100 = (TypeManager *)
                  analysis::ConstantManager::GetDefiningInstruction
                            (pCVar7,pCVar11,0,(inst_iterator *)0x0);
      pIVar8->opcode_ = OpSelect;
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_104 = Instruction::result_id(local_f8);
      init_list._M_len = 1;
      init_list._M_array = &local_104;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list);
      local_98._0_4_ = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8),&local_d8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_98);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8));
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
      local_104 = Instruction::result_id(local_f0);
      init_list_00._M_len = 1;
      init_list_00._M_array = &local_104;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list_00);
      local_98._0_4_ = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8),&local_d8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_98);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8));
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
      local_104 = Instruction::result_id((Instruction *)local_100);
      init_list_01._M_len = 1;
      init_list_01._M_array = &local_104;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list_01);
      local_98._0_4_ = 1;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8),&local_d8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&new_operands,(Operand *)local_98);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)(local_98 + 8));
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
      pIVar8 = local_e0;
      Instruction::SetInOperands(local_e0,&new_operands);
      IRContext::UpdateDefUse(local_a8,pIVar8);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&new_operands);
      return true;
    }
    __assert_fail("var_id != 0 && \"Could not get SubgroupLocalInvocationId variable.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x164,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  __assert_fail("mask_inst->NumInOperands() == 3 && \"The mask is suppose to have 3 components.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                ,0x15a,
                "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
               );
}

Assistant:

bool ReplaceSwizzleInvocationsMasked(
    IRContext* ctx, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::DefUseManager* def_use_mgr = ctx->get_def_use_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  ctx->AddCapability(spv::Capability::GroupNonUniformBallot);
  ctx->AddCapability(spv::Capability::GroupNonUniformShuffle);

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  // Get the operands to inst, and the components of the mask
  uint32_t data_id = inst->GetSingleWordInOperand(2);

  Instruction* mask_inst = def_use_mgr->GetDef(inst->GetSingleWordInOperand(3));
  assert(mask_inst->opcode() == spv::Op::OpConstantComposite &&
         "The mask is suppose to be a vector constant.");
  assert(mask_inst->NumInOperands() == 3 &&
         "The mask is suppose to have 3 components.");

  uint32_t uint_x = mask_inst->GetSingleWordInOperand(0);
  uint32_t uint_y = mask_inst->GetSingleWordInOperand(1);
  uint32_t uint_z = mask_inst->GetSingleWordInOperand(2);

  // Get the subgroup invocation id.
  uint32_t var_id = ctx->GetBuiltinInputVarId(
      uint32_t(spv::BuiltIn::SubgroupLocalInvocationId));
  ctx->AddExtension("SPV_KHR_shader_ballot");
  assert(var_id != 0 && "Could not get SubgroupLocalInvocationId variable.");
  Instruction* var_inst = ctx->get_def_use_mgr()->GetDef(var_id);
  Instruction* var_ptr_type =
      ctx->get_def_use_mgr()->GetDef(var_inst->type_id());
  uint32_t uint_type_id = var_ptr_type->GetSingleWordInOperand(1);

  Instruction* id = ir_builder.AddLoad(uint_type_id, var_id);

  // Do the bitwise operations.
  uint32_t mask_extended = ir_builder.GetUintConstantId(0xFFFFFFE0);
  Instruction* and_mask = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseOr, uint_x, mask_extended);
  Instruction* and_result =
      ir_builder.AddBinaryOp(uint_type_id, spv::Op::OpBitwiseAnd,
                             id->result_id(), and_mask->result_id());
  Instruction* or_result = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseOr, and_result->result_id(), uint_y);
  Instruction* target_inv = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseXor, or_result->result_id(), uint_z);

  // Do the group operations
  uint32_t uint_max_id = ir_builder.GetUintConstantId(0xFFFFFFFF);
  uint32_t subgroup_scope =
      ir_builder.GetUintConstantId(uint32_t(spv::Scope::Subgroup));
  const auto* ballot_value_const = const_mgr->GetConstant(
      type_mgr->GetUIntVectorType(4),
      {uint_max_id, uint_max_id, uint_max_id, uint_max_id});
  Instruction* ballot_value =
      const_mgr->GetDefiningInstruction(ballot_value_const);
  Instruction* is_active = ir_builder.AddNaryOp(
      type_mgr->GetBoolTypeId(), spv::Op::OpGroupNonUniformBallotBitExtract,
      {subgroup_scope, ballot_value->result_id(), target_inv->result_id()});
  Instruction* shuffle =
      ir_builder.AddNaryOp(inst->type_id(), spv::Op::OpGroupNonUniformShuffle,
                           {subgroup_scope, data_id, target_inv->result_id()});

  // Create the null constant to use in the select.
  const auto* null = const_mgr->GetConstant(type_mgr->GetType(inst->type_id()),
                                            std::vector<uint32_t>());
  Instruction* null_inst = const_mgr->GetDefiningInstruction(null);

  // Build the select.
  inst->SetOpcode(spv::Op::OpSelect);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {is_active->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {shuffle->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {null_inst->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}